

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

int generate_key_from_aid(char *account_id,uint8_t *key)

{
  short sVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char byte [3];
  uint8_t aid [8];
  short local_34;
  undefined1 local_32;
  uint8_t local_30 [8];
  
  lVar4 = 0;
  while( true ) {
    sVar1 = *(short *)(account_id + lVar4 * 2);
    local_32 = 0;
    local_34 = sVar1;
    lVar3 = strtol((char *)&local_34,(char **)0x0,0x10);
    local_30[lVar4] = (uint8_t)lVar3;
    iVar2 = -1;
    if (((uint8_t)lVar3 == '\0') && (sVar1 != 0x3030)) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 8) {
      if (account_id[0x10] == '\0') {
        cma_keygen(local_30,key);
        iVar2 = 0;
      }
      return iVar2;
    }
  }
  return -1;
}

Assistant:

int generate_key_from_aid(const char *account_id, uint8_t key[0x20]) {
  int i;
  uint8_t aid[8];
  for (i = 0; i < 0x08; i++) {
    char byte[3];
    memcpy(byte, &account_id[2*i], 2);
    byte[2] = '\0';
    aid[i] = strtol(byte, NULL, 16);
    if (aid[i] == 0 && !(byte[0] == '0' && byte[1] == '0')) {
      return -1;
    }
  }
  if (account_id[2*i] != '\0') {
    return -1;
  }
  cma_keygen(aid, key);
  return 0;
}